

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadSymbol(HuffmanCode *table,VP8LBitReader *br)

{
  byte bVar1;
  uint32_t uVar2;
  VP8LBitReader *in_RSI;
  long in_RDI;
  uint32_t val;
  int nbits;
  byte *local_8;
  
  uVar2 = VP8LPrefetchBits(in_RSI);
  local_8 = (byte *)(in_RDI + (ulong)(uVar2 & 0xff) * 4);
  bVar1 = *local_8;
  if (0 < (int)(bVar1 - 8)) {
    VP8LSetBitPos(in_RSI,in_RSI->bit_pos_ + 8);
    uVar2 = VP8LPrefetchBits(in_RSI);
    local_8 = local_8 + (ulong)(uVar2 & (1 << ((byte)(bVar1 - 8) & 0x1f)) - 1U) * 4 +
                        (long)(int)(uint)*(ushort *)(local_8 + 2) * 4;
  }
  VP8LSetBitPos(in_RSI,in_RSI->bit_pos_ + (uint)*local_8);
  return (int)*(ushort *)(local_8 + 2);
}

Assistant:

static WEBP_INLINE int ReadSymbol(const HuffmanCode* table,
                                  VP8LBitReader* const br) {
  int nbits;
  uint32_t val = VP8LPrefetchBits(br);
  table += val & HUFFMAN_TABLE_MASK;
  nbits = table->bits - HUFFMAN_TABLE_BITS;
  if (nbits > 0) {
    VP8LSetBitPos(br, br->bit_pos_ + HUFFMAN_TABLE_BITS);
    val = VP8LPrefetchBits(br);
    table += table->value;
    table += val & ((1 << nbits) - 1);
  }
  VP8LSetBitPos(br, br->bit_pos_ + table->bits);
  return table->value;
}